

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::learn_SM(cb_adf *mydata,multi_learner *base,multi_ex *examples)

{
  value_type peVar1;
  action_scores action_vals;
  multi_ex *examples_00;
  reference ppeVar2;
  multi_ex *pmVar3;
  action_score *paVar4;
  v_array<COST_SENSITIVE::label> *prepped_cs_labels;
  v_array<COST_SENSITIVE::label> *pvVar5;
  size_t sVar6;
  cb_class *pcVar7;
  ulong uVar8;
  uint *puVar9;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  long in_RDI;
  float fVar10;
  uint32_t current_action_1;
  uint32_t i_4;
  uint32_t current_action;
  uint32_t i_3;
  uint32_t i_2;
  label ld;
  uint32_t i_1;
  float example_weight;
  uint32_t chosen_action;
  float sign_offset;
  uint32_t i;
  action_score *paVar11;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffe90;
  v_array<unsigned_int> *this;
  action_scores *a_s;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  label *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  size_t in_stack_fffffffffffffee8;
  score_iterator *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  v_array<COST_SENSITIVE::label> *in_stack_ffffffffffffff00;
  score_iterator *in_stack_ffffffffffffff08;
  v_array<CB::label> *in_stack_ffffffffffffff10;
  multi_ex *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint32_t uVar12;
  uint local_d8;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  uint local_c8;
  uint local_c4;
  v_array<CB::cb_class> local_60;
  uint local_3c;
  float local_38;
  uint32_t local_34;
  undefined4 local_30;
  uint32_t local_2c;
  undefined4 local_28;
  uint32_t local_24;
  float local_20;
  uint local_1c;
  vector<example_*,_std::allocator<example_*>_> *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  GEN_CS::gen_cs_test_example
            ((multi_ex *)in_stack_fffffffffffffeb0,
             (label *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  paVar11 = (action_score *)0x0;
  GEN_CS::call_cs_ldf<false>
            ((multi_learner *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,(label *)in_stack_ffffffffffffff08,
             in_stack_ffffffffffffff00,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
             ,CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  v_array<ACTION_SCORE::action_score>::clear(in_stack_fffffffffffffe90);
  v_array<ACTION_SCORE::action_score>::clear(in_stack_fffffffffffffe90);
  local_1c = 0;
  while( true ) {
    examples_00 = (multi_ex *)(ulong)local_1c;
    ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    pmVar3 = (multi_ex *)
             v_array<ACTION_SCORE::action_score>::size
                       ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar2)->pred).scalars);
    if (pmVar3 <= examples_00) break;
    in_stack_ffffffffffffff08 = (score_iterator *)(local_8 + 0xd8);
    ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar2)->pred).scalars,
                        (ulong)local_1c);
    local_24 = paVar4->action;
    ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar2)->pred).scalars,
                        (ulong)local_1c);
    local_20 = paVar4->score;
    v_array<ACTION_SCORE::action_score>::push_back(in_stack_fffffffffffffe90,paVar11);
    in_stack_ffffffffffffff10 = (v_array<CB::label> *)(local_8 + 0xf8);
    ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_18,0);
    paVar4 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar2)->pred).scalars,
                        (ulong)local_1c);
    local_2c = paVar4->action;
    local_28 = 0;
    v_array<ACTION_SCORE::action_score>::push_back(in_stack_fffffffffffffe90,paVar11);
    local_1c = local_1c + 1;
  }
  local_30 = 0x3f800000;
  local_34 = 0;
  local_38 = 1.0;
  local_3c = 0;
  while( true ) {
    prepped_cs_labels = (v_array<COST_SENSITIVE::label> *)(ulong)local_3c;
    pvVar5 = (v_array<COST_SENSITIVE::label> *)
             std::vector<example_*,_std::allocator<example_*>_>::size(local_18);
    if (pvVar5 <= prepped_cs_labels) break;
    ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                        (local_18,(ulong)local_3c);
    peVar1 = *ppeVar2;
    local_60._begin = *(cb_class **)&(peVar1->l).multi;
    local_60._end = (cb_class *)(peVar1->l).cs.costs._end;
    local_60.end_array = (cb_class *)(peVar1->l).cs.costs.end_array;
    local_60.erase_count = (peVar1->l).cs.costs.erase_count;
    sVar6 = v_array<CB::cb_class>::size(&local_60);
    if (sVar6 == 1) {
      pcVar7 = v_array<CB::cb_class>::operator[](&local_60,0);
      if ((pcVar7->cost != 3.4028235e+38) || (NAN(pcVar7->cost))) {
        local_34 = local_3c;
        pcVar7 = v_array<CB::cb_class>::operator[](&local_60,0);
        in_stack_fffffffffffffefc = pcVar7->cost;
        v_array<CB::cb_class>::operator[](&local_60,0);
        local_38 = GEN_CS::safe_probability(5.361535e-39);
        local_38 = in_stack_fffffffffffffefc / local_38;
        pcVar7 = v_array<CB::cb_class>::operator[](&local_60,0);
        if (pcVar7->cost < 0.0) {
          local_30 = 0xbf800000;
          local_38 = -local_38;
        }
        break;
      }
    }
    local_3c = local_3c + 1;
  }
  puVar9 = *(uint **)(local_8 + 0xd8);
  this = *(v_array<unsigned_int> **)(local_8 + 0xe0);
  a_s = *(action_scores **)(local_8 + 0xe8);
  action_vals._begin._4_4_ = in_stack_fffffffffffffed4;
  action_vals._begin._0_4_ = in_stack_fffffffffffffed0;
  action_vals._end = (action_score *)in_stack_fffffffffffffed8;
  action_vals.end_array = (action_score *)in_stack_fffffffffffffee0;
  action_vals.erase_count = in_stack_fffffffffffffee8;
  GEN_CS::gen_cs_example_sm
            ((multi_ex *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (uint32_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),(float)in_stack_fffffffffffffeb8,
             action_vals,in_stack_fffffffffffffeb0);
  ACTION_SCORE::begin_scores(a_s);
  ACTION_SCORE::end_scores(a_s);
  ACTION_SCORE::begin_scores(a_s);
  ACTION_SCORE::end_scores(a_s);
  exploration::generate_softmax<ACTION_SCORE::score_iterator,ACTION_SCORE::score_iterator>
            ((float)((ulong)in_stack_ffffffffffffff10 >> 0x20),in_stack_ffffffffffffff08,
             (score_iterator *)prepped_cs_labels,
             (score_iterator *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0);
  local_c4 = 0;
  do {
    uVar8 = (ulong)local_c4;
    sVar6 = v_array<ACTION_SCORE::action_score>::size
                      ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8));
    if (sVar6 <= uVar8) {
LAB_003a642e:
      v_array<unsigned_int>::clear(this);
      v_array<unsigned_int>::clear(this);
      local_c8 = 0;
      while( true ) {
        uVar8 = (ulong)local_c8;
        sVar6 = v_array<ACTION_SCORE::action_score>::size
                          ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8));
        if (sVar6 <= uVar8) break;
        paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                            ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8),(ulong)local_c8
                            );
        in_stack_ffffffffffffff34 = paVar11->action;
        ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                            (local_18,(ulong)in_stack_ffffffffffffff34);
        in_stack_ffffffffffffff30 = (undefined4)(long)(*ppeVar2)->weight;
        v_array<unsigned_int>::push_back(this,puVar9);
        std::vector<example_*,_std::allocator<example_*>_>::operator[]
                  (local_18,(ulong)in_stack_ffffffffffffff34);
        v_array<unsigned_int>::push_back(this,puVar9);
        fVar10 = local_38;
        if (in_stack_ffffffffffffff34 == local_34) {
          paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                              ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8),
                               (ulong)local_c8);
          fVar10 = fVar10 * (1.0 - paVar11->score);
          ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_18,(ulong)in_stack_ffffffffffffff34);
          (*ppeVar2)->weight = fVar10;
        }
        else {
          paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                              ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8),
                               (ulong)local_c8);
          fVar10 = fVar10 * paVar11->score;
          ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_18,(ulong)in_stack_ffffffffffffff34);
          (*ppeVar2)->weight = fVar10;
        }
        ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                            (local_18,(ulong)in_stack_ffffffffffffff34);
        if ((*ppeVar2)->weight <= 1e-15) {
          ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                              (local_18,(ulong)in_stack_ffffffffffffff34);
          (*ppeVar2)->weight = 0.0;
        }
        local_c8 = local_c8 + 1;
      }
      GEN_CS::call_cs_ldf<true>
                ((multi_learner *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 examples_00,in_stack_ffffffffffffff10,(label *)in_stack_ffffffffffffff08,
                 prepped_cs_labels,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      local_d8 = 0;
      while( true ) {
        uVar8 = (ulong)local_d8;
        sVar6 = v_array<ACTION_SCORE::action_score>::size
                          ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8));
        if (sVar6 <= uVar8) break;
        paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                            ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8),(ulong)local_d8
                            );
        uVar12 = paVar11->action;
        puVar9 = v_array<unsigned_int>::operator[]
                           ((v_array<unsigned_int> *)(local_8 + 0x138),(ulong)local_d8);
        fVar10 = (float)*puVar9;
        ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                            (local_18,(ulong)uVar12);
        (*ppeVar2)->weight = fVar10;
        puVar9 = v_array<unsigned_int>::operator[]
                           ((v_array<unsigned_int> *)(local_8 + 0x118),(ulong)local_d8);
        uVar8 = (ulong)*puVar9;
        ppeVar2 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                            (local_18,(ulong)uVar12);
        (*ppeVar2)->num_features = uVar8;
        local_d8 = local_d8 + 1;
      }
      return;
    }
    paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                        ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8),(ulong)local_c4);
    if (paVar11->action == local_34) {
      paVar11 = v_array<ACTION_SCORE::action_score>::operator[]
                          ((v_array<ACTION_SCORE::action_score> *)(local_8 + 0xf8),(ulong)local_c4);
      local_38 = paVar11->score * local_38;
      goto LAB_003a642e;
    }
    local_c4 = local_c4 + 1;
  } while( true );
}

Assistant:

void learn_SM(cb_adf& mydata, multi_learner& base, multi_ex& examples) {
  gen_cs_test_example(examples, mydata.cs_labels);  // create test labels.
  call_cs_ldf<false>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  // Can probably do this more efficiently than 6 loops over the examples...
  //[1: initialize temporary storage;
  // 2: find chosen action;
  // 3: create cs_labels (gen_cs_example_sm);
  // 4: get probability of chosen action;
  // 5: backup example wts;
  // 6: restore example wts]
  mydata.a_s.clear();
  mydata.prob_s.clear();
  // TODO: Check that predicted scores are always stored with the first example
  for (uint32_t i = 0; i < examples[0]->pred.a_s.size(); i++)
  {
    mydata.a_s.push_back({examples[0]->pred.a_s[i].action, examples[0]->pred.a_s[i].score});
    mydata.prob_s.push_back({examples[0]->pred.a_s[i].action, 0.0});
  }

  float sign_offset = 1.0;    // To account for negative rewards/costs
  uint32_t chosen_action = 0;
  float example_weight = 1.0;

  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
    {
      chosen_action = i;
      example_weight = ld.costs[0].cost / safe_probability(ld.costs[0].probability);

      // Importance weights of examples cannot be negative.
      // So we use a trick: set |w| as weight, and use sign(w) as an offset in the regression target.
      if (ld.costs[0].cost < 0.0)
      {
        sign_offset = -1.0;
        example_weight = -example_weight;
      }
      break;
    }
  }

  gen_cs_example_sm(examples, chosen_action, sign_offset, mydata.a_s, mydata.cs_labels);

  // Lambda is -1 in the call to generate_softmax because in vw, lower score is better; for softmax higher score is better.
  generate_softmax(-1.0, begin_scores(mydata.a_s), end_scores(mydata.a_s), begin_scores(mydata.prob_s), end_scores(mydata.prob_s));

  // TODO: Check Marco's example that causes VW to report prob > 1.

  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)  // Scale example_wt by prob of chosen action
  {
    if (mydata.prob_s[i].action == chosen_action)
    {
      example_weight *= mydata.prob_s[i].score;
      break;
    }
  }

  mydata.backup_weights.clear();
  mydata.backup_nf.clear();
    for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    mydata.backup_weights.push_back(examples[current_action]->weight);
    mydata.backup_nf.push_back(examples[current_action]->num_features);

    if (current_action == chosen_action)
      examples[current_action]->weight = example_weight * (1.0 - mydata.prob_s[i].score);
    else
      examples[current_action]->weight = example_weight * mydata.prob_s[i].score;

    if (examples[current_action]->weight <= 1e-15)
      examples[current_action]->weight = 0;
  }

  //Do actual training
  call_cs_ldf<true>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);

  //Restore example weights and numFeatures
  for (uint32_t i = 0; i < mydata.prob_s.size(); i++)
  {
    uint32_t current_action = mydata.prob_s[i].action;
    examples[current_action]->weight = mydata.backup_weights[i];
    examples[current_action]->num_features = mydata.backup_nf[i];
  }
}